

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O2

ssh_hash * sha1_ni_new(ssh_hashalg *alg)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  ssh_hash *psVar4;
  void *pvVar5;
  ulong uVar6;
  
  puVar1 = (undefined8 *)alg->extra;
  if (*(char *)puVar1[1] == '\0') {
    bVar3 = (*(code *)*puVar1)();
    puVar2 = (undefined1 *)puVar1[1];
    puVar2[1] = bVar3;
    *puVar2 = 1;
  }
  else {
    bVar3 = ((char *)puVar1[1])[1] & 1;
  }
  if (bVar3 == 0) {
    psVar4 = (ssh_hash *)0x0;
  }
  else {
    pvVar5 = safemalloc(0xaf,1,0);
    uVar6 = (long)pvVar5 + 0xfU & 0xfffffffffffffff0;
    *(void **)(uVar6 + 0x70) = pvVar5;
    *(ssh_hashalg **)(uVar6 + 0x90) = alg;
    *(code **)(uVar6 + 0x78) = sha1_ni_write;
    *(undefined8 *)(uVar6 + 0x80) = 0;
    psVar4 = (ssh_hash *)(uVar6 + 0x90);
    *(ulong *)(uVar6 + 0x88) = uVar6 + 0x78;
    *(ulong *)(uVar6 + 0x98) = uVar6 + 0x78;
  }
  return psVar4;
}

Assistant:

static ssh_hash *sha1_ni_new(const ssh_hashalg *alg)
{
    const struct sha1_extra *extra = (const struct sha1_extra *)alg->extra;
    if (!check_availability(extra))
        return NULL;

    sha1_ni *s = sha1_ni_alloc();

    s->hash.vt = alg;
    BinarySink_INIT(s, sha1_ni_write);
    BinarySink_DELEGATE_INIT(&s->hash, s);
    return &s->hash;
}